

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::checkOverallStructure(ModuleBase *module)

{
  bool bVar1;
  int iVar2;
  ProcessorBase *processorOrGraph;
  undefined4 extraout_var;
  ModuleBase *module_00;
  pool_ref<soul::AST::ModuleBase> local_58;
  pool_ref<soul::AST::ModuleBase> m;
  pool_ref<soul::AST::ModuleBase> *__end2;
  pool_ref<soul::AST::ModuleBase> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_30;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2;
  pool_ptr<soul::AST::ProcessorBase> local_18;
  pool_ptr<soul::AST::ProcessorBase> p;
  ModuleBase *module_local;
  
  p.object = (ProcessorBase *)module;
  cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_18,module);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_18);
  if (bVar1) {
    processorOrGraph = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_18);
    checkOverallStructureOfProcessor(processorOrGraph);
  }
  pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_18);
  iVar2 = (*((p.object)->super_ModuleBase).super_Scope._vptr_Scope[0x11])
                    (&((p.object)->super_ModuleBase).super_Scope);
  __begin2 = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var,iVar2);
  local_30 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&__begin2;
  __end2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_30);
  m.object = (ModuleBase *)ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_30);
  for (; (ModuleBase *)__end2 != m.object; __end2 = __end2 + 1) {
    local_58 = (pool_ref<soul::AST::ModuleBase>)__end2->object;
    module_00 = pool_ref::operator_cast_to_ModuleBase_((pool_ref *)&local_58);
    checkOverallStructure(module_00);
    pool_ref<soul::AST::ModuleBase>::~pool_ref(&local_58);
  }
  return;
}

Assistant:

static void checkOverallStructure (AST::ModuleBase& module)
    {
        if (auto p = cast<AST::ProcessorBase> (module))
            checkOverallStructureOfProcessor (*p);

        for (auto m : module.getSubModules())
            checkOverallStructure (m);
    }